

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall t_rs_generator::generate_typedef(t_rs_generator *this,t_typedef *ttypedef)

{
  t_type *ttype;
  ostream *poVar1;
  string actual_type;
  string local_60;
  string local_40;
  
  ttype = t_typedef::get_type(ttypedef);
  to_rust_type_abi_cxx11_(&local_40,this,ttype);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"pub type ");
  rust_safe_name(&local_60,this,&ttypedef->symbolic_);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,";");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_60);
  std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void t_rs_generator::generate_typedef(t_typedef* ttypedef) {
  std::string actual_type = to_rust_type(ttypedef->get_type());
  f_gen_ << "pub type " << rust_safe_name(ttypedef->get_symbolic()) << " = " << actual_type << ";" << endl;
  f_gen_ << endl;
}